

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

void __thiscall cursespp::AppLayout::KeyPress(AppLayout *this)

{
  string *in_RSI;
  
  KeyPress((AppLayout *)
           ((long)&this[-1].super_LayoutBase.FocusWrapped.
                   super__signal_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>
                   .m_connected_slots.
                   super__List_base<sigslot::_connection_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>_*>_>
                   ._M_impl._M_node + 8),in_RSI);
  return;
}

Assistant:

bool AppLayout::KeyPress(const std::string& key) {
    /* otherwise, see if the user is monkeying around with the
    shortcut bar focus... */
    const auto shortcutsFocused = this->shortcuts->IsFocused();
    if (key == "^["  ||
        (key == "KEY_ENTER" && shortcutsFocused) ||
        (key == "KEY_UP" && shortcutsFocused))
    {
        if (shortcutsFocused) {
            this->BlurShortcuts();
        }
        else {
            this->FocusShortcuts();
        }
        return true;
    }

    if (shortcutsFocused) {
        if (key == "KEY_DOWN" || key == "KEY_LEFT" ||
            key == "KEY_UP" || key == "KEY_RIGHT")
        {
            /* layouts allow focusing via TAB and sometimes arrow
            keys. suppress these from bubbling. */
            return true;
        }
    }

    /* otherwise, pass along to our child layout */
    if (this->layout->KeyPress(key)) {
        return true;
    }

    /* the child layout didn't handle it directly, so let's walk
    up the parent hierarchy to see if there's someone who can. */
    auto focus = this->layout->GetFocus().get();
    while (focus != nullptr && focus != this) {
        auto asKeyHandler = dynamic_cast<IKeyHandler*>(focus);
        if (asKeyHandler) {
            if (asKeyHandler->KeyPress(key)) {
                return true;
            }
        }
        focus = focus->GetParent();
    }

    return false;
}